

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

ActionResultHolder<int> *
testing::internal::ActionResultHolder<int>::PerformAction<int(int,int)>
          (Action<int_(int,_int)> *action,ArgumentTuple *args)

{
  Result RVar1;
  ActionResultHolder<int> *pAVar2;
  _Tuple_impl<0UL,_int,_int> local_20;
  
  pAVar2 = (ActionResultHolder<int> *)operator_new(0x10);
  local_20 = args->super__Tuple_impl<0UL,_int,_int>;
  RVar1 = Action<int_(int,_int)>::Perform(action,(ArgumentTuple *)&local_20);
  (pAVar2->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__UntypedActionResultHolderBase_00190350;
  (pAVar2->result_).value_ = RVar1;
  return pAVar2;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }